

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O1

vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
optimization::common_expr_del::BlockNodes::cast_operands_abi_cxx11_
          (vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,BlockNodes *this,
          vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *value)

{
  _Rb_tree_header *p_Var1;
  pointer pVVar2;
  _Base_ptr p_Var3;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar4;
  mapped_type *pmVar5;
  variant_alternative_t<0UL,_variant<int,_VarId>_> *pvVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  pointer pVVar9;
  VarId var;
  Value val;
  anon_class_1_0_00000001 local_c1;
  vector<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>,std::allocator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>>
  *local_c0;
  BlockNodes *local_b8;
  map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
  *local_b0;
  key_type local_a8;
  _Variadic_union<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  byte local_78;
  undefined1 local_70 [16];
  uint local_60;
  undefined1 local_58;
  undefined2 local_57;
  undefined **local_50;
  variant<int,_mir::inst::VarId> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar9 = (value->super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (value->super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_c0 = (vector<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>,std::allocator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>>
              *)__return_storage_ptr__;
  if (pVVar9 != pVVar2) {
    local_b0 = &this->var_map;
    p_Var1 = &(this->var_map)._M_t._M_impl.super__Rb_tree_header;
    local_b8 = this;
    do {
      local_48.super__Variant_base<int,_mir::inst::VarId>.
      super__Move_assign_alias<int,_mir::inst::VarId>.
      super__Copy_assign_alias<int,_mir::inst::VarId>.super__Move_ctor_alias<int,_mir::inst::VarId>.
      super__Copy_ctor_alias<int,_mir::inst::VarId>.
      super__Variant_storage_alias<int,_mir::inst::VarId>._M_index = pVVar9->field_0x18;
      local_98._0_8_ = &local_48;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
        ::_S_vtable._M_arr[(long)(char)pVVar9->field_0x18 + 1]._M_data)
                ((anon_class_8_1_a78179b7_conflict *)&local_98,
                 (variant<int,_mir::inst::VarId> *)&pVVar9->field_0x8);
      local_50 = &PTR_display_001effc8;
      local_48.super__Variant_base<int,_mir::inst::VarId>.
      super__Move_assign_alias<int,_mir::inst::VarId>.
      super__Copy_assign_alias<int,_mir::inst::VarId>.super__Move_ctor_alias<int,_mir::inst::VarId>.
      super__Copy_ctor_alias<int,_mir::inst::VarId>.
      super__Variant_storage_alias<int,_mir::inst::VarId>._17_1_ = pVVar9->shift;
      local_48.super__Variant_base<int,_mir::inst::VarId>.
      super__Move_assign_alias<int,_mir::inst::VarId>.
      super__Copy_assign_alias<int,_mir::inst::VarId>.super__Move_ctor_alias<int,_mir::inst::VarId>.
      super__Copy_ctor_alias<int,_mir::inst::VarId>.
      super__Variant_storage_alias<int,_mir::inst::VarId>._18_1_ = pVVar9->shift_amount;
      if (local_48.super__Variant_base<int,_mir::inst::VarId>.
          super__Move_assign_alias<int,_mir::inst::VarId>.
          super__Copy_assign_alias<int,_mir::inst::VarId>.
          super__Move_ctor_alias<int,_mir::inst::VarId>.
          super__Copy_ctor_alias<int,_mir::inst::VarId>.
          super__Variant_storage_alias<int,_mir::inst::VarId>._M_index == '\0') {
        pvVar6 = std::get<0ul,int,mir::inst::VarId>(&local_48);
        local_98._M_first._M_storage = (_Uninitialized<int,_true>)*pvVar6;
        local_78 = 0;
        std::
        vector<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>,std::allocator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>>
        ::emplace_back<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>
                  (local_c0,(variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_98._M_first);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_78]._M_data)
                  ((anon_class_1_0_00000001 *)&local_a8,
                   (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98._M_first);
      }
      else {
        pvVar4 = std::get<1ul,int,mir::inst::VarId>(&local_48);
        local_a8.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
        local_a8.id = pvVar4->id;
        p_Var3 = (local_b8->var_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
            p_Var3 = (&p_Var3->_M_left)[*(uint *)((long)(p_Var3 + 1) + 8) < local_a8.id]) {
          if (*(uint *)((long)(p_Var3 + 1) + 8) >= local_a8.id) {
            p_Var7 = p_Var3;
          }
        }
        p_Var8 = p_Var1;
        if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
           (p_Var8 = (_Rb_tree_header *)p_Var7, local_a8.id < *(uint *)((long)p_Var7 + 0x28))) {
          p_Var8 = p_Var1;
        }
        if (p_Var8 == p_Var1) {
          local_70._8_8_ = &PTR_display_001ee058;
          local_58 = 1;
          local_70._0_8_ = &PTR_display_001effc8;
          local_57._0_1_ = Lsl;
          local_57._1_1_ = '\0';
          local_60 = local_a8.id;
          add_leaf_node(local_b8,(Value *)local_70);
        }
        pmVar5 = std::
                 map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
                 ::operator[](local_b0,&local_a8);
        local_98._M_first._M_storage = (_Uninitialized<int,_true>)pmVar5->id;
        local_78 = 1;
        std::
        vector<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>,std::allocator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>>
        ::emplace_back<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>
                  (local_c0,(variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_98._M_first);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_78]._M_data)
                  (&local_c1,
                   (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98._M_first);
      }
      pVVar9 = pVVar9 + 1;
    } while (pVVar9 != pVVar2);
  }
  return (vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_c0;
}

Assistant:

std::vector<Operand> cast_operands(std::vector<mir::inst::Value> value) {
    std::vector<Operand> operands;
    for (auto val : value) {
      if (val.index() == 0) {
        operands.push_back(std::get<int>(val));
      } else {
        auto var = std::get<mir::inst::VarId>(val);
        if (!query_var(var)) {
          add_leaf_node(var);
        }
        auto nodeId = var_map[var];
        operands.push_back(nodeId);
      }
    }
    return operands;
  }